

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1objs.c
# Opt level: O3

FT_Error T1_Driver_Init(FT_Module module)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  undefined1 local_18 [8];
  FT_Module module_local;
  
  *(undefined4 *)&module[2].library = 1;
  *(undefined1 *)((long)&module[2].library + 4) = 1;
  module[2].memory = (FT_Memory)0x190000001f4;
  module[3].clazz = (FT_Module_Class *)0x113000003e8;
  module[3].library = (FT_Library)0x11300000683;
  module[3].memory = (FT_Memory)0x91d;
  uVar1 = (int)&module_local + 4U ^ (uint)local_18 ^ *(uint *)&module->memory;
  uVar4 = uVar1 >> 0x14 ^ uVar1 >> 10;
  uVar2 = uVar4 ^ uVar1;
  *(uint *)&module[4].clazz = uVar2;
  if ((int)uVar1 < 0) {
    iVar3 = -uVar2;
  }
  else {
    iVar3 = 0x75bcd15;
    if (uVar4 != uVar1) {
      return 0;
    }
  }
  *(int *)&module[4].clazz = iVar3;
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Driver_Init( FT_Module  module )
  {
    PS_Driver  driver = (PS_Driver)module;

    FT_UInt32  seed;


    /* set default property values, cf. `ftt1drv.h' */
#ifdef T1_CONFIG_OPTION_OLD_ENGINE
    driver->hinting_engine = FT_HINTING_FREETYPE;
#else
    driver->hinting_engine = FT_HINTING_ADOBE;
#endif

    driver->no_stem_darkening = TRUE;

    driver->darken_params[0] = CFF_CONFIG_OPTION_DARKENING_PARAMETER_X1;
    driver->darken_params[1] = CFF_CONFIG_OPTION_DARKENING_PARAMETER_Y1;
    driver->darken_params[2] = CFF_CONFIG_OPTION_DARKENING_PARAMETER_X2;
    driver->darken_params[3] = CFF_CONFIG_OPTION_DARKENING_PARAMETER_Y2;
    driver->darken_params[4] = CFF_CONFIG_OPTION_DARKENING_PARAMETER_X3;
    driver->darken_params[5] = CFF_CONFIG_OPTION_DARKENING_PARAMETER_Y3;
    driver->darken_params[6] = CFF_CONFIG_OPTION_DARKENING_PARAMETER_X4;
    driver->darken_params[7] = CFF_CONFIG_OPTION_DARKENING_PARAMETER_Y4;

    /* compute random seed from some memory addresses */
    seed = (FT_UInt32)( (FT_Offset)(char*)&seed          ^
                        (FT_Offset)(char*)&module        ^
                        (FT_Offset)(char*)module->memory );
    seed = seed ^ ( seed >> 10 ) ^ ( seed >> 20 );

    driver->random_seed = (FT_Int32)seed;
    if ( driver->random_seed < 0 )
      driver->random_seed = -driver->random_seed;
    else if ( driver->random_seed == 0 )
      driver->random_seed = 123456789;

    return FT_Err_Ok;
  }